

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O1

void __thiscall
VW::config::options_boost_po::
add_to_description_impl<VW::config::typelist<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (options_boost_po *this,shared_ptr<VW::config::base_option> *opt,
          options_description *options_description)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  undefined8 extraout_RAX;
  options_description *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  element_type *peVar3;
  _Alloc_hider this_01;
  shared_ptr<VW::config::base_option> opt_00;
  element_type *local_28;
  _Alloc_hider local_20;
  
  peVar3 = (element_type *)&stack0xffffffffffffffd8;
  local_28 = (opt->super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_20._M_p =
       (pointer)(opt->super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
  if ((options_boost_po *)local_20._M_p != (options_boost_po *)0x0) {
    in_RCX = (options_description *)&__libc_single_threaded;
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((options_boost_po *)local_20._M_p)->m_options)._M_t._M_impl =
           *(int *)&(((options_boost_po *)local_20._M_p)->m_options)._M_t._M_impl + 1;
      UNLOCK();
    }
    else {
      *(int *)&(((options_boost_po *)local_20._M_p)->m_options)._M_t._M_impl =
           *(int *)&(((options_boost_po *)local_20._M_p)->m_options)._M_t._M_impl + 1;
    }
  }
  bVar1 = add_if_t<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    (this,(shared_ptr<VW::config::base_option> *)&stack0xffffffffffffffd8,
                     options_description);
  _Var2._M_pi = extraout_RDX;
  this_01._M_p = local_20._M_p;
  if ((options_boost_po *)local_20._M_p != (options_boost_po *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20._M_p);
    _Var2._M_pi = extraout_RDX_00;
  }
  if (bVar1) {
    return;
  }
  this_00 = (opt->super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  opt_00.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  opt_00.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  add_to_description_impl<VW::config::typelist<>>((options_boost_po *)this_01._M_p,opt_00,in_RCX);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void add_to_description_impl(std::shared_ptr<base_option> opt, po::options_description& options_description)
  {
    if (add_if_t<typename TTypes::head>(opt, options_description))
    {
      return;
    }
    add_to_description_impl<typename TTypes::tail>(opt, options_description);
  }